

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

void xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int val;
  xmlXPathObjectPtr val_00;
  int iStack_20;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs == 1) {
    if (ctxt->valueNr < 1) {
      iStack_20 = 0x17;
    }
    else {
      val_00 = xmlXPathValuePop(ctxt);
      if (val_00 != (xmlXPathObjectPtr)0x0) {
        if (val_00->type != XPATH_BOOLEAN) {
          val = xmlXPathCastToBoolean(val_00);
          xmlXPathReleaseObject(ctxt->context,val_00);
          val_00 = xmlXPathCacheNewBoolean(ctxt,val);
        }
        xmlXPathValuePush(ctxt,val_00);
        return;
      }
      iStack_20 = 10;
    }
  }
  else {
    iStack_20 = 0xc;
  }
  xmlXPathErr(ctxt,iStack_20);
  return;
}

Assistant:

void
xmlXPathBooleanFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    CHECK_ARITY(1);
    cur = xmlXPathValuePop(ctxt);
    if (cur == NULL) XP_ERROR(XPATH_INVALID_OPERAND);
    if (cur->type != XPATH_BOOLEAN) {
        int boolval = xmlXPathCastToBoolean(cur);

        xmlXPathReleaseObject(ctxt->context, cur);
        cur = xmlXPathCacheNewBoolean(ctxt, boolval);
    }
    xmlXPathValuePush(ctxt, cur);
}